

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O3

Type * __thiscall
google::protobuf::util::converter::anon_unknown_0::TypeInfoForTypeResolver::GetTypeByTypeUrl
          (TypeInfoForTypeResolver *this,StringPiece type_url)

{
  undefined8 uVar1;
  int local_50 [2];
  StatusOrType result;
  
  (*(this->super_TypeInfo)._vptr_TypeInfo[2])(local_50,this,type_url.ptr_,type_url.length_);
  if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
    operator_delete((void *)result.status_._0_8_);
  }
  uVar1 = (Type *)0x0;
  if (local_50[0] == 0) {
    uVar1 = result.status_.error_message_.field_2._8_8_;
  }
  return (Type *)uVar1;
}

Assistant:

const google::protobuf::Type* GetTypeByTypeUrl(
      StringPiece type_url) const override {
    StatusOrType result = ResolveTypeUrl(type_url);
    return result.ok() ? result.value() : NULL;
  }